

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::Canceler::release(Canceler *this)

{
  AdapterBase *pAVar1;
  AdapterBase *a;
  Canceler *this_local;
  
  while( true ) {
    pAVar1 = kj::_::readMaybe<kj::Canceler::AdapterBase>(&this->list);
    if (pAVar1 == (AdapterBase *)0x0) break;
    Maybe<kj::Canceler::AdapterBase&>::operator=
              ((Maybe<kj::Canceler::AdapterBase&> *)this,&pAVar1->next);
    Maybe<kj::Maybe<kj::Canceler::AdapterBase_&>_&>::operator=
              (&pAVar1->prev,(Maybe<kj::Canceler::AdapterBase_&> *)0x0);
    Maybe<kj::Canceler::AdapterBase_&>::operator=(&pAVar1->next,(AdapterBase *)0x0);
  }
  return;
}

Assistant:

void Canceler::release() {
  for (;;) {
    KJ_IF_MAYBE(a, list) {
      list = a->next;
      a->prev = nullptr;
      a->next = nullptr;
    } else {
      break;
    }
  }